

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O1

void cursespp::SchemaOverlay::ShowDoubleOverlay
               (DoubleEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  double *__args;
  Type TVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  double value;
  uint __val;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  InputOverlay *pIVar7;
  _func_void *p_Var8;
  OverlayStack *this_00;
  runtime_error *this_01;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uint __len;
  DoubleEntry *doubleEntry;
  string __str;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  formatter;
  shared_ptr<cursespp::InputOverlay> dialog;
  shared_ptr<cursespp::NumberValidator<double>_> validator;
  anon_class_80_3_1ce9ae6c handler;
  string title;
  string name;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  double *local_1f0;
  string local_1e8;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  InputOverlay *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  NumberValidator<double> *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  long *local_188 [2];
  long local_178 [2];
  ILayoutPtr local_168;
  shared_ptr<cursespp::InputOverlay::IValidator> local_158;
  long *local_148 [2];
  long local_138 [2];
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  _Any_data local_d8;
  code *local_c8;
  double local_b8;
  string local_b0;
  _Any_data local_90;
  code *local_80;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(entry->entry).name,(allocator<char> *)&local_108);
  local_1c8._8_8_ = 0;
  local_1c8._4_4_ = 0;
  local_1c8._0_4_ = entry->precision;
  pcStack_1b0 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:86:12)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:86:12)>
              ::_M_manager;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50,local_48 + (long)local_50);
  local_1f0 = (double *)entry->minValue;
  local_b8 = entry->maxValue;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
              *)&local_90,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
              *)&local_1c8);
  numberInputTitle<double>
            (&local_70,&local_b0,(double)local_1f0,local_b8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
              *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  __args = &entry->minValue;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_198 = (NumberValidator<double> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cursespp::NumberValidator<double>,std::allocator<cursespp::NumberValidator<double>>,double_const&,double_const&,std::function<std::__cxx11::string(double)>&>
            (&local_190,&local_198,(allocator<cursespp::NumberValidator<double>_> *)&local_108,
             __args,&entry->maxValue,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
              *)&local_1c8);
  local_108 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  local_100 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_100->_M_use_count = local_100->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_100->_M_use_count = local_100->_M_use_count + 1;
    }
  }
  local_f8 = local_e8;
  local_1f0 = &entry->maxValue;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_50,local_48 + (long)local_50);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_d8,callback);
  pIVar7 = (InputOverlay *)operator_new(0x308);
  InputOverlay::InputOverlay(pIVar7);
  local_1a8 = pIVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cursespp::InputOverlay*>
            (&local_1a0,pIVar7);
  std::__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cursespp::InputOverlay,cursespp::InputOverlay>
            ((__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_1a8,pIVar7);
  pIVar7 = InputOverlay::SetTitle(local_1a8,&local_70);
  peVar2 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
  }
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,(entry->entry).name,&local_1f1);
  switch(TVar1) {
  case Bool:
    bVar4 = (**(code **)(*(long *)peVar2 + 0x50))(peVar2,local_148,*(undefined1 *)__args);
    pcVar11 = "false";
    if (bVar4 != 0) {
      pcVar11 = "true";
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,pcVar11,pcVar11 + ((ulong)bVar4 ^ 5));
    break;
  case Int:
    uVar5 = (**(code **)(*(long *)peVar2 + 0x58))(peVar2,local_148,*(undefined4 *)local_1f0);
    __val = -uVar5;
    if (0 < (int)uVar5) {
      __val = uVar5;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_00175ef6;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_00175ef6;
        }
        if (uVar9 < 10000) goto LAB_00175ef6;
        uVar10 = uVar10 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_00175ef6:
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)__len - (char)((int)uVar5 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1e8._M_dataplus._M_p + (uVar5 >> 0x1f),__len,__val);
    break;
  case Double:
    iVar6 = entry->precision;
    value = (double)(**(code **)(*(long *)peVar2 + 0x60))
                              (SUB84(entry->defaultValue,0),peVar2,local_148);
    stringValueForDouble_abi_cxx11_(&local_1e8,value,iVar6);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,(char *)*__args,&local_1f2);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_1e8,peVar2,local_148,local_188);
    goto LAB_00175e56;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,*(char **)&entry->precision,&local_1f2);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_1e8,peVar2,local_148,local_188);
LAB_00175e56:
    if (local_188[0] != local_178) {
      operator_delete(local_188[0],local_178[0] + 1);
    }
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"invalid type passed to stringValueFor!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  pIVar7 = InputOverlay::SetText(pIVar7,&local_1e8);
  local_158.super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &local_198->super_IValidator;
  local_158.super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_190._M_pi;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
    }
  }
  pIVar7 = InputOverlay::SetValidator(pIVar7,&local_158);
  iVar6 = Screen::GetWidth();
  pIVar7 = InputOverlay::SetWidth(pIVar7,(int)((float)iVar6 * 0.8));
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  p_Var8 = (_func_void *)operator_new(0x50);
  *(element_type **)p_Var8 = local_108;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var8 + 8) = local_100;
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_100->_M_use_count = local_100->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_100->_M_use_count = local_100->_M_use_count + 1;
    }
  }
  *(_func_void **)(p_Var8 + 0x10) = p_Var8 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var8 + 0x10),local_f8,local_f0 + (long)local_f8);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(p_Var8 + 0x30),
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_d8);
  pcStack_110 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:335:20)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:335:20)>
              ::_M_manager;
  local_128._M_unused._M_function_pointer = p_Var8;
  InputOverlay::SetInputAcceptedCallback(pIVar7,(InputAcceptedCallback *)&local_128);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (local_158.super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.
               super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  this_00 = App::Overlays();
  local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_1a8->super_OverlayBase).super_LayoutBase.super_ILayout;
  if (local_1a8 == (InputOverlay *)0x0) {
    local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1a0._M_pi;
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a0._M_pi)->_M_use_count = (local_1a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a0._M_pi)->_M_use_count = (local_1a0._M_pi)->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this_00,&local_168);
  if (local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void SchemaOverlay::ShowDoubleOverlay(
    const ISchema::DoubleEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);

    auto formatter = doubleFormatter(entry->precision);

    auto title = numberInputTitle(
        name, entry->minValue, entry->maxValue, formatter);

    auto validator = std::make_shared<NumberValidator<double>>(
        entry->minValue, entry->maxValue, formatter);

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetDouble(name, std::stod(value));
        if (callback) { callback(value); }
    };

    std::shared_ptr<InputOverlay> dialog(new InputOverlay());

    dialog->SetTitle(title)
        .SetText(stringValueFor(prefs, entry))
        .SetValidator(validator)
        .SetWidth(overlayWidth())
        .SetInputAcceptedCallback(handler);

    App::Overlays().Push(dialog);
}